

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O2

bool __thiscall Assimp::RemoveVCProcess::ProcessMesh(RemoveVCProcess *this,aiMesh *pMesh)

{
  bool bVar1;
  aiVector3D **ppaVar2;
  aiColor4D **ppaVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  uVar7 = this->configDeleteFlags;
  if ((uVar7 >> 0xb & 1) != 0) {
    pMesh->mMaterialIndex = 0;
    uVar7 = this->configDeleteFlags;
  }
  if (((uVar7 & 2) == 0) || (pMesh->mNormals == (aiVector3D *)0x0)) {
    bVar1 = false;
  }
  else {
    operator_delete__(pMesh->mNormals);
    pMesh->mNormals = (aiVector3D *)0x0;
    uVar7 = this->configDeleteFlags;
    bVar1 = true;
  }
  if (((uVar7 & 4) != 0) && (pMesh->mTangents != (aiVector3D *)0x0)) {
    operator_delete__(pMesh->mTangents);
    pMesh->mTangents = (aiVector3D *)0x0;
    if (pMesh->mBitangents != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mBitangents);
    }
    pMesh->mBitangents = (aiVector3D *)0x0;
    uVar7 = this->configDeleteFlags;
    bVar1 = true;
  }
  uVar9 = 0;
  for (iVar8 = 0; iVar8 != 8; iVar8 = iVar8 + 1) {
    uVar6 = this->configDeleteFlags;
    if (pMesh->mTextureCoords[uVar9] == (aiVector3D *)0x0) goto LAB_0014a20c;
    if ((uVar6 & 0x2000000 << ((byte)iVar8 & 0x1f)) == 0 && (uVar7 & 0x10) == 0) {
LAB_0014a1c8:
      uVar9 = uVar9 + 1;
    }
    else {
      operator_delete__(pMesh->mTextureCoords[uVar9]);
      pMesh->mTextureCoords[uVar9] = (aiVector3D *)0x0;
      bVar1 = true;
      if ((uVar7 & 0x10) != 0) goto LAB_0014a1c8;
      ppaVar2 = pMesh->mTextureCoords + (uVar9 + 1);
      uVar6 = uVar9;
      while( true ) {
        uVar4 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        if (7 < uVar6) break;
        pMesh->mTextureCoords[uVar4] = *ppaVar2;
        ppaVar2 = ppaVar2 + 1;
      }
      pMesh->mTextureCoords[7] = (aiVector3D *)0x0;
      bVar1 = true;
    }
  }
  uVar6 = this->configDeleteFlags;
LAB_0014a20c:
  uVar4 = 0;
  for (iVar8 = 0; iVar8 != 8; iVar8 = iVar8 + 1) {
    uVar7 = this->configDeleteFlags;
    if (pMesh->mColors[uVar4] == (aiColor4D *)0x0) goto LAB_0014a2b8;
    if ((uVar7 & 1 << ((char)uVar4 + 0x14U & 0x1f)) == 0 && (uVar6 & 8) == 0) {
LAB_0014a276:
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    else {
      operator_delete__(pMesh->mColors[uVar4]);
      pMesh->mColors[uVar4] = (aiColor4D *)0x0;
      bVar1 = true;
      if ((uVar6 & 8) != 0) goto LAB_0014a276;
      ppaVar3 = pMesh->mColors + ((int)uVar4 + 1);
      uVar5 = uVar4;
      while (uVar7 = (int)uVar5 + 1, uVar7 < 8) {
        pMesh->mColors[uVar5] = *ppaVar3;
        ppaVar3 = ppaVar3 + 1;
        uVar5 = (ulong)uVar7;
      }
      pMesh->mColors[7] = (aiColor4D *)0x0;
      bVar1 = true;
    }
  }
  uVar7 = this->configDeleteFlags;
LAB_0014a2b8:
  if (((uVar7 & 0x20) != 0) && (pMesh->mBones != (aiBone **)0x0)) {
    ArrayDelete<aiBone>(&pMesh->mBones,&pMesh->mNumBones);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool RemoveVCProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;

    // if all materials have been deleted let the material
    // index of the mesh point to the created default material
    if ( configDeleteFlags & aiComponent_MATERIALS)
        pMesh->mMaterialIndex = 0;

    // handle normals
    if (configDeleteFlags & aiComponent_NORMALS && pMesh->mNormals)
    {
        delete[] pMesh->mNormals;
        pMesh->mNormals = NULL;
        ret = true;
    }

    // handle tangents and bitangents
    if (configDeleteFlags & aiComponent_TANGENTS_AND_BITANGENTS && pMesh->mTangents)
    {
        delete[] pMesh->mTangents;
        pMesh->mTangents = NULL;

        delete[] pMesh->mBitangents;
        pMesh->mBitangents = NULL;
        ret = true;
    }

    // handle texture coordinates
    bool b = (0 != (configDeleteFlags & aiComponent_TEXCOORDS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++real)
    {
        if (!pMesh->mTextureCoords[i])break;
        if (configDeleteFlags & aiComponent_TEXCOORDSn(real) || b)
        {
            delete [] pMesh->mTextureCoords[i];
            pMesh->mTextureCoords[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a)
                    pMesh->mTextureCoords[a-1] = pMesh->mTextureCoords[a];

                pMesh->mTextureCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle vertex colors
    b = (0 != (configDeleteFlags & aiComponent_COLORS));
    for (unsigned int i = 0, real = 0; real < AI_MAX_NUMBER_OF_COLOR_SETS; ++real)
    {
        if (!pMesh->mColors[i])break;
        if (configDeleteFlags & aiComponent_COLORSn(i) || b)
        {
            delete [] pMesh->mColors[i];
            pMesh->mColors[i] = NULL;
            ret = true;

            if (!b)
            {
                // collapse the rest of the array
                for (unsigned int a = i+1; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a)
                    pMesh->mColors[a-1] = pMesh->mColors[a];

                pMesh->mColors[AI_MAX_NUMBER_OF_COLOR_SETS-1] = NULL;
                continue;
            }
        }
        ++i;
    }

    // handle bones
    if (configDeleteFlags & aiComponent_BONEWEIGHTS && pMesh->mBones)
    {
        ArrayDelete(pMesh->mBones,pMesh->mNumBones);
        ret = true;
    }
    return ret;
}